

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O1

uint32 __thiscall
Clasp::Asp::RuleTransform::Impl::addRule(Impl *this,Atom_t head,bool add,uint32 bIdx,weight_t bound)

{
  pointer pWVar1;
  long lVar2;
  Atom_t AVar3;
  uint32 uVar4;
  uint uVar5;
  Atom_t local_4c;
  AtomSpan local_48;
  LitSpan local_38;
  
  pWVar1 = (this->agg_).ebo_.buf;
  if (bound < 1) {
    local_48.first = (uint *)&local_38;
    local_38.first = (int *)CONCAT44(local_38.first._4_4_,pWVar1[bIdx].lit);
    (this->lits_).ebo_.size = 0;
    bk_lib::pod_vector<int,std::allocator<int>>::insert_impl<unsigned_int,bk_lib::detail::Fill<int>>
              ((pod_vector<int,std::allocator<int>> *)&this->lits_,(this->lits_).ebo_.buf,1,
               (Fill<int> *)&local_48);
  }
  else {
    lVar2 = (this->sumR_).ebo_.buf[bIdx + 1];
    if (lVar2 - pWVar1[(this->agg_).ebo_.size - 1].weight < (long)(ulong)(uint)bound) {
      if (lVar2 < (long)(ulong)(uint)bound) {
        return 0;
      }
      uVar5 = !add + bIdx;
      (this->lits_).ebo_.size = 0;
      if (uVar5 != (this->agg_).ebo_.size) {
        do {
          bk_lib::pod_vector<int,_std::allocator<int>_>::push_back
                    (&this->lits_,&(this->agg_).ebo_.buf[uVar5].lit);
          uVar5 = uVar5 + 1;
        } while (uVar5 != (this->agg_).ebo_.size);
      }
    }
    else {
      (this->lits_).ebo_.size = 0;
      if (add) {
        bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(&this->lits_,&pWVar1[bIdx].lit);
      }
      AVar3 = getAuxVar(this,bIdx + 1,bound);
      local_48.first = (uint *)CONCAT44(local_48.first._4_4_,AVar3);
      bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(&this->lits_,(int *)&local_48);
    }
  }
  local_38.size = (size_t)(this->lits_).ebo_.size;
  local_38.first = (int *)local_38.size;
  if ((pointer)local_38.size != (pointer)0x0) {
    local_38.first = (this->lits_).ebo_.buf;
  }
  local_48.first = &local_4c;
  local_48.size = (size_t)(head != 0);
  local_4c = head;
  uVar4 = addRule(this,(Head_t)0x0,&local_48,&local_38);
  return uVar4;
}

Assistant:

uint32 RuleTransform::Impl::addRule(Atom_t head, bool add, uint32 bIdx, weight_t bound) {
	const weight_t minW = agg_.back().weight;
	const wsum_t   maxW = sumR_[bIdx + 1];
	if (bound <= 0) {
		assert(add);
		lits_.assign(1, agg_[bIdx].lit);
		return addRule(head, Potassco::toSpan(lits_));
	}
	if ((maxW - minW) < bound) {
		// remaining literals are all needed to satisfy bound
		bIdx += static_cast<uint32>(!add);
		if (maxW >= bound) {
			lits_.clear();
			for (; bIdx != agg_.size(); ++bIdx) { lits_.push_back(agg_[bIdx].lit); }
			return addRule(head, Potassco::toSpan(lits_));
		}
		return 0;
	}
	lits_.clear();
	if (add) { lits_.push_back(agg_[bIdx].lit); }
	lits_.push_back(Potassco::lit(getAuxVar(bIdx + 1, bound)));
	return addRule(head, Potassco::toSpan(lits_));
}